

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O3

void __thiscall
GlobOptBlockData::CloneBlockData
          (GlobOptBlockData *this,BasicBlock *toBlockContext,BasicBlock *fromBlock)

{
  GlobOpt *pGVar1;
  JitArenaAllocator *alloc;
  BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *other;
  CapturedValues *this_00;
  code *pcVar2;
  uint uVar3;
  bool bVar4;
  ValueHashTable<Sym_*,_Value_*> *pVVar5;
  ValueHashTable<ExprHash,_Value_*> *pVVar6;
  BVSparse<Memory::JitArenaAllocator> *pBVar7;
  BVSparse<Memory::JitArenaAllocator> *pBVar8;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *to;
  BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  undefined4 *puVar9;
  bool *pbVar10;
  
  pGVar1 = (fromBlock->globOptData).globOpt;
  this->globOpt = pGVar1;
  alloc = pGVar1->alloc;
  pVVar5 = ValueHashTable<Sym_*,_Value_*>::Copy((fromBlock->globOptData).symToValueMap);
  this->symToValueMap = pVVar5;
  pVVar6 = ValueHashTable<ExprHash,_Value_*>::Copy((fromBlock->globOptData).exprToValueMap);
  this->exprToValueMap = pVVar6;
  GlobOpt::CloneValues(this->globOpt,toBlockContext,this,&fromBlock->globOptData);
  bVar4 = GlobOpt::DoBoundCheckHoist(this->globOpt);
  if (bVar4) {
    GlobOpt::CloneBoundCheckHoistBlockData
              (this->globOpt,toBlockContext,this,fromBlock,&fromBlock->globOptData);
  }
  pBVar7 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,alloc,0x3eba5c);
  pBVar7->head = (Type_conflict)0x0;
  pBVar7->lastFoundIndex = (Type_conflict)0x0;
  pBVar7->alloc = alloc;
  pBVar7->lastUsedNodePrevNextField = (Type)pBVar7;
  this->liveFields = pBVar7;
  pBVar8 = (fromBlock->globOptData).liveFields;
  BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar8);
  BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>(pBVar7,pBVar8->head);
  pBVar7 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,alloc,0x3eba5c);
  pBVar7->head = (Type_conflict)0x0;
  pBVar7->lastFoundIndex = (Type_conflict)0x0;
  pBVar7->alloc = alloc;
  pBVar7->lastUsedNodePrevNextField = (Type)pBVar7;
  this->liveArrayValues = pBVar7;
  pBVar8 = (fromBlock->globOptData).liveArrayValues;
  BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar8);
  BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>(pBVar7,pBVar8->head);
  if ((fromBlock->globOptData).maybeWrittenTypeSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    pBVar7 = (BVSparse<Memory::JitArenaAllocator> *)
             new<Memory::JitArenaAllocator>(0x20,alloc,0x3eba5c);
    pBVar7->head = (Type_conflict)0x0;
    pBVar7->lastFoundIndex = (Type_conflict)0x0;
    pBVar7->alloc = alloc;
    pBVar7->lastUsedNodePrevNextField = (Type)pBVar7;
    this->maybeWrittenTypeSyms = pBVar7;
    pBVar8 = (fromBlock->globOptData).maybeWrittenTypeSyms;
    BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar8);
    BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>
              (pBVar7,pBVar8->head);
  }
  pBVar7 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,alloc,0x3eba5c);
  pBVar7->head = (Type_conflict)0x0;
  pBVar7->lastFoundIndex = (Type_conflict)0x0;
  pBVar7->alloc = alloc;
  pBVar7->lastUsedNodePrevNextField = (Type)pBVar7;
  this->isTempSrc = pBVar7;
  pBVar8 = (fromBlock->globOptData).isTempSrc;
  BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar8);
  BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>(pBVar7,pBVar8->head);
  pBVar7 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,alloc,0x3eba5c);
  pBVar7->head = (Type_conflict)0x0;
  pBVar7->lastFoundIndex = (Type_conflict)0x0;
  pBVar7->alloc = alloc;
  pBVar7->lastUsedNodePrevNextField = (Type)pBVar7;
  this->liveVarSyms = pBVar7;
  pBVar8 = (fromBlock->globOptData).liveVarSyms;
  BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar8);
  BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>(pBVar7,pBVar8->head);
  pBVar7 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,alloc,0x3eba5c);
  pBVar7->head = (Type_conflict)0x0;
  pBVar7->lastFoundIndex = (Type_conflict)0x0;
  pBVar7->alloc = alloc;
  pBVar7->lastUsedNodePrevNextField = (Type)pBVar7;
  this->liveInt32Syms = pBVar7;
  pBVar8 = (fromBlock->globOptData).liveInt32Syms;
  BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar8);
  BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>(pBVar7,pBVar8->head);
  pBVar7 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,alloc,0x3eba5c);
  pBVar7->head = (Type_conflict)0x0;
  pBVar7->lastFoundIndex = (Type_conflict)0x0;
  pBVar7->alloc = alloc;
  pBVar7->lastUsedNodePrevNextField = (Type)pBVar7;
  this->liveLossyInt32Syms = pBVar7;
  pBVar8 = (fromBlock->globOptData).liveLossyInt32Syms;
  BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar8);
  BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>(pBVar7,pBVar8->head);
  pBVar7 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,alloc,0x3eba5c);
  pBVar7->head = (Type_conflict)0x0;
  pBVar7->lastFoundIndex = (Type_conflict)0x0;
  pBVar7->alloc = alloc;
  pBVar7->lastUsedNodePrevNextField = (Type)pBVar7;
  this->liveFloat64Syms = pBVar7;
  pBVar8 = (fromBlock->globOptData).liveFloat64Syms;
  BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar8);
  BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>(pBVar7,pBVar8->head);
  bVar4 = GlobOpt::TrackArgumentsObject(this->globOpt);
  if ((bVar4) &&
     (pBVar8 = (fromBlock->globOptData).argObjSyms,
     pBVar8 != (BVSparse<Memory::JitArenaAllocator> *)0x0)) {
    pBVar8 = BVSparse<Memory::JitArenaAllocator>::CopyNew(pBVar8,alloc);
    this->argObjSyms = pBVar8;
  }
  pBVar8 = (fromBlock->globOptData).maybeTempObjectSyms;
  pBVar7 = pBVar8;
  if (pBVar8 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
LAB_0048fc27:
    pBVar8 = (fromBlock->globOptData).canStoreTempObjectSyms;
    if (pBVar8 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      do {
        pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)pBVar8->head;
        if (pBVar8 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0048fc98;
      } while (((Type *)&pBVar8->alloc)->word == 0);
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                         ,0x129,
                         "(fromData->canStoreTempObjectSyms == nullptr || fromData->canStoreTempObjectSyms->IsEmpty())"
                         ,
                         "fromData->canStoreTempObjectSyms == nullptr || fromData->canStoreTempObjectSyms->IsEmpty()"
                        );
      if (!bVar4) goto LAB_0048fee3;
      *puVar9 = 0;
    }
  }
  else {
    do {
      pBVar7 = (BVSparse<Memory::JitArenaAllocator> *)pBVar7->head;
      if (pBVar7 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0048fc27;
    } while (((Type *)&pBVar7->alloc)->word == 0);
    pBVar8 = BVSparse<Memory::JitArenaAllocator>::CopyNew(pBVar8,alloc);
    this->maybeTempObjectSyms = pBVar8;
    pBVar8 = (fromBlock->globOptData).canStoreTempObjectSyms;
    pBVar7 = pBVar8;
    if (pBVar8 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      do {
        pBVar7 = (BVSparse<Memory::JitArenaAllocator> *)pBVar7->head;
        if (pBVar7 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0048fc98;
      } while (((Type *)&pBVar7->alloc)->word == 0);
      pBVar8 = BVSparse<Memory::JitArenaAllocator>::CopyNew(pBVar8,alloc);
      this->canStoreTempObjectSyms = pBVar8;
    }
  }
LAB_0048fc98:
  this->curFunc = (fromBlock->globOptData).curFunc;
  if ((fromBlock->globOptData).callSequence ==
      (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    this->callSequence = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  }
  else {
    to = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
         new<Memory::JitArenaAllocator>(0x10,alloc,0x3eba5c);
    (to->super_SListNodeBase<Memory::ArenaAllocator>).next = (Type)to;
    (to->super_RealCount).count = 0;
    this->callSequence = to;
    SListBase<IR::Opnd*,Memory::ArenaAllocator,RealCount>::
    CopyTo<&SListBase<IR::Opnd*,Memory::ArenaAllocator,RealCount>::DefaultCopyElement>
              ((SListBase<IR::Opnd*,Memory::ArenaAllocator,RealCount> *)
               (fromBlock->globOptData).callSequence,&alloc->super_ArenaAllocator,to);
  }
  uVar3 = (fromBlock->globOptData).argOutCount;
  this->startCallCount = (fromBlock->globOptData).startCallCount;
  this->argOutCount = uVar3;
  this->totalOutParamCount = (fromBlock->globOptData).totalOutParamCount;
  this->inlinedArgOutSize = (fromBlock->globOptData).inlinedArgOutSize;
  this->hasCSECandidates = (fromBlock->globOptData).hasCSECandidates;
  other = (fromBlock->globOptData).stackLiteralInitFldDataMap;
  if ((other == (BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)0x0) ||
     ((this->globOpt->prePassLoop != (Loop *)0x0 &&
      (((toBlockContext->field_0x18 & 4) == 0 ||
       (toBlockContext->loop != this->globOpt->rootLoopPrePass)))))) {
    this_01 = (BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               *)0x0;
  }
  else {
    this_01 = (BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               *)new<Memory::JitArenaAllocator>(0x38,other->alloc,0x3eba5c);
    JsUtil::
    BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(this_01,other);
  }
  this->stackLiteralInitFldDataMap = this_01;
  pBVar7 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,alloc,0x3eba5c);
  pBVar7->head = (Type_conflict)0x0;
  pBVar7->lastFoundIndex = (Type_conflict)0x0;
  pBVar7->alloc = alloc;
  pBVar7->lastUsedNodePrevNextField = (Type)pBVar7;
  this->changedSyms = pBVar7;
  pBVar8 = (fromBlock->globOptData).changedSyms;
  BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar8);
  BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>(pBVar7,pBVar8->head);
  this_00 = (fromBlock->globOptData).capturedValues;
  this->capturedValues = this_00;
  if (this_00 != (CapturedValues *)0x0) {
    CapturedValues::IncrementRefCount(this_00);
  }
  pbVar10 = (fromBlock->globOptData).hasDataRef;
  if (pbVar10 == (bool *)0x0) {
LAB_0048fe09:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x151,"(fromData->HasData())","fromData->HasData()");
    if (!bVar4) goto LAB_0048fee3;
    *puVar9 = 0;
  }
  else if (*pbVar10 == false) {
    (fromBlock->globOptData).hasDataRef = (bool *)0x0;
    goto LAB_0048fe09;
  }
  if (alloc == (JitArenaAllocator *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.h"
                       ,0xd0,"(allocator)","allocator");
    if (!bVar4) {
LAB_0048fee3:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar9 = 0;
  }
  pbVar10 = (bool *)new<Memory::JitArenaAllocator>(1,alloc,0x3eba5c);
  *pbVar10 = true;
  this->hasDataRef = pbVar10;
  return;
}

Assistant:

void GlobOptBlockData::CloneBlockData(BasicBlock *const toBlockContext, BasicBlock *const fromBlock)
{
    GlobOptBlockData *const fromData = &fromBlock->globOptData;

    this->globOpt = fromData->globOpt;

    JitArenaAllocator *const alloc = this->globOpt->alloc;

    this->symToValueMap = fromData->symToValueMap->Copy();
    this->exprToValueMap = fromData->exprToValueMap->Copy();

    // Clone the values as well to allow for flow-sensitive ValueInfo
    this->globOpt->CloneValues(toBlockContext, this, fromData);

    if(this->globOpt->DoBoundCheckHoist())
    {
        this->globOpt->CloneBoundCheckHoistBlockData(toBlockContext, this, fromBlock, fromData);
    }

    this->liveFields = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveFields->Copy(fromData->liveFields);

    this->liveArrayValues = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveArrayValues->Copy(fromData->liveArrayValues);

    if (fromData->maybeWrittenTypeSyms)
    {
        this->maybeWrittenTypeSyms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
        this->maybeWrittenTypeSyms->Copy(fromData->maybeWrittenTypeSyms);
    }

    this->isTempSrc = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->isTempSrc->Copy(fromData->isTempSrc);

    this->liveVarSyms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveVarSyms->Copy(fromData->liveVarSyms);

    this->liveInt32Syms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveInt32Syms->Copy(fromData->liveInt32Syms);

    this->liveLossyInt32Syms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveLossyInt32Syms->Copy(fromData->liveLossyInt32Syms);

    this->liveFloat64Syms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveFloat64Syms->Copy(fromData->liveFloat64Syms);

    if (this->globOpt->TrackArgumentsObject() && fromData->argObjSyms)
    {
        this->argObjSyms = fromData->argObjSyms->CopyNew(alloc);
    }
    if (fromData->maybeTempObjectSyms && !fromData->maybeTempObjectSyms->IsEmpty())
    {
        this->maybeTempObjectSyms = fromData->maybeTempObjectSyms->CopyNew(alloc);
        if (fromData->canStoreTempObjectSyms && !fromData->canStoreTempObjectSyms->IsEmpty())
        {
            this->canStoreTempObjectSyms = fromData->canStoreTempObjectSyms->CopyNew(alloc);
        }
    }
    else
    {
        Assert(fromData->canStoreTempObjectSyms == nullptr || fromData->canStoreTempObjectSyms->IsEmpty());
    }

    this->curFunc = fromData->curFunc;
    if (fromData->callSequence != nullptr)
    {
        this->callSequence = JitAnew(alloc, SListBase<IR::Opnd *>);
        fromData->callSequence->CopyTo(alloc, *(this->callSequence));
    }
    else
    {
        this->callSequence = nullptr;
    }

    this->startCallCount = fromData->startCallCount;
    this->argOutCount = fromData->argOutCount;
    this->totalOutParamCount = fromData->totalOutParamCount;
    this->inlinedArgOutSize = fromData->inlinedArgOutSize;
    this->hasCSECandidates = fromData->hasCSECandidates;

    // Although we don't need the data on loop pre pass, we need to do it for the loop header
    // because we capture the loop header bailout on loop prepass
    if (fromData->stackLiteralInitFldDataMap != nullptr &&
        (!this->globOpt->IsLoopPrePass() || (toBlockContext->isLoopHeader && toBlockContext->loop == this->globOpt->rootLoopPrePass)))
    {
        this->stackLiteralInitFldDataMap = fromData->stackLiteralInitFldDataMap->Clone();
    }
    else
    {
        this->stackLiteralInitFldDataMap = nullptr;
    }

    this->changedSyms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->changedSyms->Copy(fromData->changedSyms);
    this->capturedValues = fromData->capturedValues;
    if (this->capturedValues)
    {
        this->capturedValues->IncrementRefCount();
    }

    Assert(fromData->HasData());
    this->OnDataInitialized(alloc);
}